

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZone::getOffset
          (TimeZone *this,UDate date,UBool local,int32_t *rawOffset,int32_t *dstOffset,
          UErrorCode *ec)

{
  uint uVar1;
  int32_t iVar2;
  int32_t iVar3;
  UBool UVar4;
  byte bVar5;
  int8_t iVar6;
  int iVar7;
  double day_00;
  double dVar8;
  int32_t millis;
  double day;
  uint local_50;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int32_t pass;
  UErrorCode *ec_local;
  int32_t *dstOffset_local;
  int32_t *rawOffset_local;
  UDate UStack_20;
  UBool local_local;
  UDate date_local;
  TimeZone *this_local;
  
  _year = ec;
  ec_local = dstOffset;
  dstOffset_local = rawOffset;
  rawOffset_local._7_1_ = local;
  UStack_20 = date;
  date_local = (UDate)this;
  UVar4 = ::U_FAILURE(*ec);
  if (UVar4 == '\0') {
    iVar7 = (*(this->super_UObject)._vptr_UObject[8])();
    *dstOffset_local = iVar7;
    if (rawOffset_local._7_1_ == '\0') {
      UStack_20 = (double)*dstOffset_local + UStack_20;
    }
    month = 0;
    while( true ) {
      day_00 = uprv_floor_63(UStack_20 / 86400000.0);
      dVar8 = -day_00 * 86400000.0 + UStack_20;
      Grego::dayToFields(day_00,&dom,&dow,(int32_t *)&local_50,(int32_t *)((long)&day + 4));
      iVar3 = dom;
      iVar2 = dow;
      uVar1 = local_50;
      bVar5 = (byte)day._4_4_;
      iVar6 = Grego::monthLength(dom,dow);
      iVar7 = (*(this->super_UObject)._vptr_UObject[5])
                        (this,1,(ulong)(uint)iVar3,(ulong)(uint)iVar2,(ulong)uVar1,(ulong)bVar5,
                         (int)dVar8,(int)iVar6,_year);
      *ec_local = iVar7 - *dstOffset_local;
      if (((month != 0) || (rawOffset_local._7_1_ == '\0')) || (*ec_local == U_ZERO_ERROR)) break;
      UStack_20 = UStack_20 - (double)*ec_local;
      month = 1;
    }
  }
  return;
}

Assistant:

void TimeZone::getOffset(UDate date, UBool local, int32_t& rawOffset,
                         int32_t& dstOffset, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return;
    }

    rawOffset = getRawOffset();
    if (!local) {
        date += rawOffset; // now in local standard millis
    }

    // When local == TRUE, date might not be in local standard
    // millis.  getOffset taking 7 parameters used here assume
    // the given time in day is local standard time.
    // At STD->DST transition, there is a range of time which
    // does not exist.  When 'date' is in this time range
    // (and local == TRUE), this method interprets the specified
    // local time as DST.  At DST->STD transition, there is a
    // range of time which occurs twice.  In this case, this
    // method interprets the specified local time as STD.
    // To support the behavior above, we need to call getOffset
    // (with 7 args) twice when local == true and DST is
    // detected in the initial call.
    for (int32_t pass=0; ; ++pass) {
        int32_t year, month, dom, dow;
        double day = uprv_floor(date / U_MILLIS_PER_DAY);
        int32_t millis = (int32_t) (date - day * U_MILLIS_PER_DAY);

        Grego::dayToFields(day, year, month, dom, dow);

        dstOffset = getOffset(GregorianCalendar::AD, year, month, dom,
                              (uint8_t) dow, millis,
                              Grego::monthLength(year, month),
                              ec) - rawOffset;

        // Recompute if local==TRUE, dstOffset!=0.
        if (pass!=0 || !local || dstOffset == 0) {
            break;
        }
        // adjust to local standard millis
        date -= dstOffset;
    }
}